

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O2

QMap<int,_QMultiMap<QByteArray,_int>_> __thiscall
Generator::methodsWithAutomaticTypesHelper(Generator *this,QList<FunctionDef> *methodList)

{
  long lVar1;
  bool bVar2;
  QMultiMap<QByteArray,_int> *this_00;
  long in_RDX;
  QByteArray *propertyType;
  long in_FS_OFFSET;
  int local_40;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this->parser = (Moc *)0x0;
  local_3c = 0;
  while( true ) {
    if (*(long *)(in_RDX + 0x10) <= (long)local_3c) break;
    lVar1 = *(long *)(in_RDX + 8) + (long)local_3c * 0xd0;
    local_40 = 0;
    while( true ) {
      if (*(long *)(lVar1 + 0x50) <= (long)local_40) break;
      propertyType = (QByteArray *)(*(long *)(lVar1 + 0x48) + (long)local_40 * 0xa8 + 0x58);
      bVar2 = registerableMetaType((Generator *)methodList,propertyType);
      if (bVar2) {
        bVar2 = isBuiltinType(propertyType);
        if (!bVar2) {
          this_00 = QMap<int,_QMultiMap<QByteArray,_int>_>::operator[]
                              ((QMap<int,_QMultiMap<QByteArray,_int>_> *)this,&local_3c);
          QMultiMap<QByteArray,_int>::insert(this_00,propertyType,&local_40);
        }
      }
      local_40 = local_40 + 1;
    }
    local_3c = local_3c + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>_>
            )(QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>_>
              )this;
  }
  __stack_chk_fail();
}

Assistant:

QMap<int, QMultiMap<QByteArray, int>>
Generator::methodsWithAutomaticTypesHelper(const QList<FunctionDef> &methodList)
{
    QMap<int, QMultiMap<QByteArray, int> > methodsWithAutomaticTypes;
    for (int i = 0; i < methodList.size(); ++i) {
        const FunctionDef &f = methodList.at(i);
        for (int j = 0; j < f.arguments.size(); ++j) {
            const QByteArray &argType = f.arguments.at(j).normalizedType;
            if (registerableMetaType(argType) && !isBuiltinType(argType))
                methodsWithAutomaticTypes[i].insert(argType, j);
        }
    }
    return methodsWithAutomaticTypes;
}